

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsa_Initialize(PaUtilHostApiRepresentation **hostApi,PaHostApiIndex hostApiIndex)

{
  int iVar1;
  PaUint32 PVar2;
  PaAlsaHostApiRepresentation *alsaApi;
  PaUtilAllocationGroup *pPVar3;
  PaHostApiIndex in_ESI;
  long *in_RDI;
  PaAlsaHostApiRepresentation *alsaHostApi;
  PaError result;
  code *in_stack_ffffffffffffff90;
  PaError local_38;
  PaError local_24;
  
  iVar1 = PaAlsa_LoadLibrary();
  if (iVar1 == 0) {
    local_24 = -0x26fb;
  }
  else {
    alsaApi = (PaAlsaHostApiRepresentation *)PaUtil_AllocateMemory((long)in_stack_ffffffffffffff90);
    if (alsaApi == (PaAlsaHostApiRepresentation *)0x0) {
      PaUtil_DebugPrint(
                       "Expression \'alsaHostApi = (PaAlsaHostApiRepresentation*) PaUtil_AllocateMemory( sizeof(PaAlsaHostApiRepresentation) )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 747\n"
                       );
      local_38 = -0x2708;
    }
    else {
      pPVar3 = PaUtil_CreateAllocationGroup();
      alsaApi->allocations = pPVar3;
      if (pPVar3 == (PaUtilAllocationGroup *)0x0) {
        PaUtil_DebugPrint(
                         "Expression \'alsaHostApi->allocations = PaUtil_CreateAllocationGroup()\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 748\n"
                         );
        local_38 = -0x2708;
      }
      else {
        alsaApi->hostApiIndex = in_ESI;
        PVar2 = PaAlsaVersionNum();
        alsaApi->alsaLibVersion = PVar2;
        *in_RDI = (long)alsaApi;
        *(undefined4 *)(*in_RDI + 8) = 1;
        *(undefined4 *)(*in_RDI + 0xc) = 8;
        *(char **)(*in_RDI + 0x10) = "ALSA";
        *(code **)(*in_RDI + 0x30) = Terminate;
        *(code **)(*in_RDI + 0x38) = OpenStream;
        *(code **)(*in_RDI + 0x40) = IsFormatSupported;
        paUtilErr_ = BuildDeviceList(alsaApi);
        if (paUtilErr_ < 0) {
          PaUtil_DebugPrint(
                           "Expression \'BuildDeviceList( alsaHostApi )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 766\n"
                           );
          local_38 = paUtilErr_;
        }
        else {
          PaUtil_InitializeStreamInterface
                    (&alsaApi->callbackStreamInterface,CloseStream,StartStream,StopStream,
                     AbortStream,IsStreamStopped,IsStreamActive,GetStreamTime,GetStreamCpuLoad,
                     PaUtil_DummyRead,PaUtil_DummyWrite,PaUtil_DummyGetReadAvailable,
                     PaUtil_DummyGetWriteAvailable);
          in_stack_ffffffffffffff90 = GetStreamTime;
          PaUtil_InitializeStreamInterface
                    (&alsaApi->blockingStreamInterface,CloseStream,StartStream,StopStream,
                     AbortStream,IsStreamStopped,IsStreamActive,GetStreamTime,PaUtil_DummyGetCpuLoad
                     ,ReadStream,WriteStream,GetStreamReadAvailable,GetStreamWriteAvailable);
          paUtilErr_ = PaUnixThreading_Initialize();
          if (-1 < paUtilErr_) {
            return 0;
          }
          PaUtil_DebugPrint(
                           "Expression \'PaUnixThreading_Initialize()\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 786\n"
                           );
          local_38 = paUtilErr_;
        }
      }
    }
    if (alsaApi != (PaAlsaHostApiRepresentation *)0x0) {
      if (alsaApi->allocations != (PaUtilAllocationGroup *)0x0) {
        PaUtil_FreeAllAllocations((PaUtilAllocationGroup *)in_stack_ffffffffffffff90);
        PaUtil_DestroyAllocationGroup((PaUtilAllocationGroup *)in_stack_ffffffffffffff90);
      }
      PaUtil_FreeMemory((void *)0x1136f0);
    }
    local_24 = local_38;
  }
  return local_24;
}

Assistant:

PaError PaAlsa_Initialize( PaUtilHostApiRepresentation **hostApi, PaHostApiIndex hostApiIndex )
{
    PaError result = paNoError;
    PaAlsaHostApiRepresentation *alsaHostApi = NULL;

    /* Try loading Alsa library. */
    if (!PaAlsa_LoadLibrary())
        return paHostApiNotFound;

    PA_UNLESS( alsaHostApi = (PaAlsaHostApiRepresentation*) PaUtil_AllocateMemory(
                sizeof(PaAlsaHostApiRepresentation) ), paInsufficientMemory );
    PA_UNLESS( alsaHostApi->allocations = PaUtil_CreateAllocationGroup(), paInsufficientMemory );
    alsaHostApi->hostApiIndex = hostApiIndex;
    alsaHostApi->alsaLibVersion = PaAlsaVersionNum();

    *hostApi = (PaUtilHostApiRepresentation*)alsaHostApi;
    (*hostApi)->info.structVersion = 1;
    (*hostApi)->info.type = paALSA;
    (*hostApi)->info.name = "ALSA";

    (*hostApi)->Terminate = Terminate;
    (*hostApi)->OpenStream = OpenStream;
    (*hostApi)->IsFormatSupported = IsFormatSupported;

    /** If AlsaErrorHandler is to be used, do not forget to unregister callback pointer in
        Terminate function.
    */
    /*ENSURE_( snd_lib_error_set_handler(AlsaErrorHandler), paUnanticipatedHostError );*/

    PA_ENSURE( BuildDeviceList( alsaHostApi ) );

    PaUtil_InitializeStreamInterface( &alsaHostApi->callbackStreamInterface,
                                      CloseStream, StartStream,
                                      StopStream, AbortStream,
                                      IsStreamStopped, IsStreamActive,
                                      GetStreamTime, GetStreamCpuLoad,
                                      PaUtil_DummyRead, PaUtil_DummyWrite,
                                      PaUtil_DummyGetReadAvailable,
                                      PaUtil_DummyGetWriteAvailable );

    PaUtil_InitializeStreamInterface( &alsaHostApi->blockingStreamInterface,
                                      CloseStream, StartStream,
                                      StopStream, AbortStream,
                                      IsStreamStopped, IsStreamActive,
                                      GetStreamTime, PaUtil_DummyGetCpuLoad,
                                      ReadStream, WriteStream,
                                      GetStreamReadAvailable,
                                      GetStreamWriteAvailable );

    PA_ENSURE( PaUnixThreading_Initialize() );

    return result;

error:
    if( alsaHostApi )
    {
        if( alsaHostApi->allocations )
        {
            PaUtil_FreeAllAllocations( alsaHostApi->allocations );
            PaUtil_DestroyAllocationGroup( alsaHostApi->allocations );
        }

        PaUtil_FreeMemory( alsaHostApi );
    }

    return result;
}